

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QSslCipher *cipher)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  long *plVar3;
  long *in_RDX;
  undefined8 *puVar4;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)cipher);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined2 *)(*plVar3 + 0x30) = 0x100;
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  QVar6.m_data = (storage_type *)0x10;
  QVar6.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
  }
  pQVar1 = *(QArrayData **)(*in_RDX + 8);
  puVar4 = *(undefined8 **)(*in_RDX + 0x10);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QString::_empty;
  }
  QDebug::putString((QChar *)cipher,(ulong)puVar4);
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
    _Var5._M_head_impl =
         (cipher->d)._M_t.
         super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
         super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
         super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  QVar7.m_data = (storage_type *)0x7;
  QVar7.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
    _Var5._M_head_impl =
         (cipher->d)._M_t.
         super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
         super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
         super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,*(int *)(*in_RDX + 0x24));
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
    _Var5._M_head_impl =
         (cipher->d)._M_t.
         super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
         super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
         super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  QVar8.m_data = (storage_type *)0x8;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
  }
  pQVar2 = *(QArrayData **)(*in_RDX + 0x78);
  puVar4 = *(undefined8 **)(*in_RDX + 0x80);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QString::_empty;
  }
  QDebug::putString((QChar *)cipher,(ulong)puVar4);
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
    _Var5._M_head_impl =
         (cipher->d)._M_t.
         super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
         super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
         super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,')');
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)((long)&(_Var5._M_head_impl)->keyExchangeMethod + 8) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)_Var5._M_head_impl,' ');
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  _Var5._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  (cipher->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
  ._M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = (QSslCipherPrivate *)0x0;
  *(QSslCipherPrivate **)debug.stream = _Var5._M_head_impl;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QSslCipher &cipher)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();
    debug << "QSslCipher(name=" << cipher.name()
          << ", bits=" << cipher.usedBits()
          << ", proto=" << cipher.protocolString()
          << ')';
    return debug;
}